

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall
Parser::parseClass(Parser *this,Token *class_token,bool expect_class_name,bool is_local)

{
  uint uVar1;
  Node *pNVar2;
  void *pvVar3;
  Node *this_00;
  value_type *ppNVar4;
  undefined8 in_RCX;
  socklen_t *__addr_len;
  undefined1 in_DL;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *psVar5;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *__addr_02;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  sockaddr *extraout_RDX_07;
  undefined8 in_RSI;
  Parser *in_RDI;
  Parser *in_stack_00000038;
  size_t i;
  Node *res;
  Node *member_3;
  Node *memberValue_3;
  Token *memberTok_3;
  Node *memberName_3;
  Node *member_2;
  Node *memberValue_2;
  Token *memberTok_2;
  Node *memberName_2;
  Node *member_1;
  Node *memberName_1;
  Node *memberValue_1;
  Token *memberTok_1;
  Node *member;
  Node *memberName;
  Node *memberValue;
  Token *memberTok;
  bool isStatic;
  vector<Node_*,_std::allocator<Node_*>_> classMembers;
  Node *extends;
  Node *className;
  ExprContextScope exprContextScope;
  vector<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>
  *in_stack_fffffffffffffe68;
  Token *in_stack_fffffffffffffe70;
  CompilationContext *in_stack_fffffffffffffe78;
  value_type *__x;
  Parser *in_stack_fffffffffffffe80;
  Token *in_stack_fffffffffffffe88;
  Parser *in_stack_fffffffffffffe90;
  Node *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  value_type *local_f0;
  Node *in_stack_ffffffffffffff40;
  Parser *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffac;
  vector<Node_*,_std::allocator<Node_*>_> local_48;
  Node *local_30;
  Node *local_28;
  byte local_12;
  byte local_11;
  Parser *this_01;
  
  __addr_len = (socklen_t *)(CONCAT71((int7)((ulong)in_RCX >> 8),in_DL) & 0xffffffffffffff01);
  local_11 = (byte)__addr_len;
  local_12 = (byte)in_RCX & 1;
  this_01 = in_RDI;
  parseClass(Token*,bool,bool)::ExprContextScope::ExprContextScope(std::vector<Parser::
  ExpressionContext,std::allocator<Parser::ExpressionContext>_>__
            ((ExprContextScope *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_28 = (Node *)0x0;
  local_30 = (Node *)0x0;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)0x11fe84);
  psVar5 = extraout_RDX;
  if ((local_11 & 1) != 0) {
    local_28 = parseDeref((Parser *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    psVar5 = extraout_RDX_00;
  }
  uVar1 = accept(in_RDI,0x55,psVar5,__addr_len);
  if ((uVar1 & 1) != 0) {
    local_30 = parseTernaryOp(in_stack_00000038);
  }
  checkBraceIdentationStyle(in_stack_fffffffffffffe80);
  expect(in_stack_ffffffffffffff48,(TokenType)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  psVar5 = extraout_RDX_01;
  while ((((in_RDI->ctx->isError ^ 0xffU) & 1) != 0 &&
         (uVar1 = accept(in_RDI,0x18,psVar5,__addr_len), (uVar1 & 1) == 0))) {
    uVar1 = accept(in_RDI,0x33,__addr,__addr_len);
    psVar5 = __addr_00;
    if ((uVar1 & 1) == 0) {
      uVar1 = accept(in_RDI,0x5a,__addr_00,__addr_len);
      uVar6 = (uVar1 & 1) << 0x18;
      psVar5 = __addr_01;
      if (((char)(uVar1 & 1) == '\0') &&
         (uVar1 = accept(in_RDI,0x56,__addr_01,__addr_len), psVar5 = extraout_RDX_02,
         (uVar1 & 1) != 0)) {
        parseFunction(this_01,(FunctionType)((ulong)in_RSI >> 0x20));
        pvVar3 = operator_new(0x30);
        Node::Node((Node *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                   in_stack_fffffffffffffe70);
        *(undefined4 *)((long)pvVar3 + 0x10) = 0x3b;
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                   (value_type *)in_stack_fffffffffffffe78);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                   (value_type *)in_stack_fffffffffffffe78);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                   (value_type *)in_stack_fffffffffffffe78);
        psVar5 = extraout_RDX_03;
      }
      else {
        uVar1 = accept(in_RDI,0x48,psVar5,__addr_len);
        if ((uVar1 & 1) == 0) {
          uVar1 = accept(in_RDI,0x19,__addr_02,__addr_len);
          if ((uVar1 & 1) == 0) {
            in_stack_fffffffffffffea7 =
                 expect(in_stack_ffffffffffffff48,
                        (TokenType)((ulong)in_stack_ffffffffffffff40 >> 0x20));
            psVar5 = extraout_RDX_06;
            if ((bool)in_stack_fffffffffffffea7) {
              in_stack_fffffffffffffe98 =
                   createIdentifierNode(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
              in_stack_ffffffffffffff40 = in_stack_fffffffffffffe98;
              expect(in_stack_ffffffffffffff48,(TokenType)((ulong)in_stack_fffffffffffffe98 >> 0x20)
                    );
              in_stack_fffffffffffffe90 = (Parser *)parseTernaryOp(in_stack_00000038);
              in_stack_fffffffffffffe88 = (Token *)operator_new(0x30);
              Node::Node((Node *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                         in_stack_fffffffffffffe70);
              uVar1 = (uVar6 >> 0x18 & 1) + 0x3b;
              __addr_len = (socklen_t *)(ulong)uVar1;
              *(uint *)&in_stack_fffffffffffffe88->u = uVar1;
              std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                        ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                         (value_type *)in_stack_fffffffffffffe78);
              std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                        ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                         (value_type *)in_stack_fffffffffffffe78);
              std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                        ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                         (value_type *)in_stack_fffffffffffffe78);
              psVar5 = extraout_RDX_07;
            }
          }
          else {
            parseTernaryOp(in_stack_00000038);
            createMakeKeyNode((Parser *)
                              CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                              (Token *)in_stack_fffffffffffffe98,(Node *)in_stack_fffffffffffffe90);
            expect(in_stack_ffffffffffffff48,(TokenType)((ulong)in_stack_ffffffffffffff40 >> 0x20));
            expect(in_stack_ffffffffffffff48,(TokenType)((ulong)in_stack_ffffffffffffff40 >> 0x20));
            parseTernaryOp(in_stack_00000038);
            in_stack_ffffffffffffff48 = (Parser *)operator_new(0x30);
            Node::Node((Node *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                       in_stack_fffffffffffffe70);
            uVar1 = (uVar6 >> 0x18 & 1) + 0x3b;
            __addr_len = (socklen_t *)(ulong)uVar1;
            *(uint *)&(in_stack_ffffffffffffff48->expressionContext).
                      super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>
                      ._M_impl.super__Vector_impl_data._M_start = uVar1;
            std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                      ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                       (value_type *)in_stack_fffffffffffffe78);
            std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                      ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                       (value_type *)in_stack_fffffffffffffe78);
            std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                      ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                       (value_type *)in_stack_fffffffffffffe78);
            psVar5 = extraout_RDX_05;
          }
        }
        else {
          pNVar2 = parseFunction(this_01,(FunctionType)((ulong)in_RSI >> 0x20));
          if (pNVar2 != (Node *)0x0) {
            std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&pNVar2->children,0);
          }
          pvVar3 = operator_new(0x30);
          Node::Node((Node *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe70);
          uVar1 = (uVar6 >> 0x18 & 1) + 0x3b;
          __addr_len = (socklen_t *)(ulong)uVar1;
          *(uint *)((long)pvVar3 + 0x10) = uVar1;
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                    ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                     (value_type *)in_stack_fffffffffffffe78);
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                    ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                     (value_type *)in_stack_fffffffffffffe78);
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                    ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe80,
                     (value_type *)in_stack_fffffffffffffe78);
          psVar5 = extraout_RDX_04;
        }
      }
    }
  }
  this_00 = (Node *)operator_new(0x30);
  Node::Node(this_00,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  this_00->nodeType = local_12 & PNT_NULL | PNT_CLASS;
  pNVar2 = this_00;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)this_00,
             (value_type *)in_stack_fffffffffffffe78);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)pNVar2,
             (value_type *)in_stack_fffffffffffffe78);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffe70,
             (value_type *)in_stack_fffffffffffffe68);
  local_f0 = (value_type *)0x0;
  while (__x = local_f0,
        ppNVar4 = (value_type *)std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_48),
        __x < ppNVar4) {
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_48,(size_type)local_f0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)pNVar2,__x);
    local_f0 = (value_type *)((long)local_f0 + 1);
  }
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)pNVar2);
  parseClass::ExprContextScope::~ExprContextScope((ExprContextScope *)0x12068e);
  return this_00;
}

Assistant:

Node * parseClass(Token * class_token, bool expect_class_name, bool is_local)
  {
    EXPRESSION_CONTEXT_SCOPE(EC_USUAL);

    Node * className = nullptr;
    Node * extends = nullptr;
    vector<Node *> classMembers;
    if (expect_class_name)
      className = parseDeref();

    if (accept(TK_EXTENDS))
      extends = parseTernaryOp();

    checkBraceIdentationStyle();
    expect(TK_LBRACE);

    while (!ctx.isError)
    {
      if (accept(TK_RBRACE))
        break;

      if (accept(TK_SEMICOLON))
        continue;

      bool isStatic = accept(TK_STATIC);

      if (!isStatic && accept(TK_CONSTRUCTOR))
      {
        Token * memberTok = tok;
        Node * memberValue = parseFunction(FT_CLASS_CONSTRUCTOR);
        Node * memberName = nullptr;

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (accept(TK_FUNCTION))
      {
        Token * memberTok = tok;
        Node * memberValue = parseFunction(FT_CLASS_METHOD);
        Node * memberName = memberValue ? memberValue->children[0] : nullptr;

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (accept(TK_LSQUARE))
      {
        Node * memberName = createMakeKeyNode(*tok, parseTernaryOp());
        expect(TK_RSQUARE);
        expect(TK_ASSIGN);
        Token * memberTok = tok;
        Node * memberValue = parseTernaryOp();

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (expect(TK_IDENTIFIER))
      {
        Node * memberName = createIdentifierNode(*tok);
        expect(TK_ASSIGN);
        Token * memberTok = tok;
        Node * memberValue = parseTernaryOp();

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
    }

    Node * res = new Node(ctx, *class_token);
    res->nodeType = is_local ? PNT_LOCAL_CLASS : PNT_CLASS;
    res->children.push_back(className);
    res->children.push_back(extends);
    res->children.push_back(nullptr); // attributes (removed code)
    for (size_t i = 0; i < classMembers.size(); i++)
      res->children.push_back(classMembers[i]);
    return res;
  }